

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy_test.cc
# Opt level: O0

void disruptor::test::SingleThreadedStrategy::IncrementAndGet_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  IncrementAndGet t;
  char (*in_stack_fffffffffffff408) [19];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff410;
  std_string *in_stack_fffffffffffff418;
  basic_cstring<const_char> *in_stack_fffffffffffff420;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff430;
  undefined1 local_ad0 [32];
  IncrementAndGet *in_stack_fffffffffffff550;
  undefined1 local_938 [16];
  basic_cstring<const_char> local_928;
  undefined1 local_911;
  basic_wrap_stringstream<char> local_910;
  undefined1 local_778 [16];
  basic_cstring<const_char> local_768;
  undefined1 local_751;
  basic_wrap_stringstream<char> local_750;
  undefined1 local_5b8 [16];
  basic_cstring<const_char> local_5a8;
  undefined1 local_591;
  basic_wrap_stringstream<char> local_590;
  undefined1 local_3f8 [16];
  basic_cstring<const_char> local_3e8 [34];
  undefined1 local_1c5;
  basic_wrap_stringstream<char> local_1b8;
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
             ,0x6c);
  memset(&local_1b8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff410);
  boost::basic_wrap_stringstream<char>::ref(&local_1b8);
  local_1c5 = 0x22;
  boost::operator<<(in_stack_fffffffffffff410,*in_stack_fffffffffffff408);
  boost::operator<<(in_stack_fffffffffffff410,(char (*) [16])in_stack_fffffffffffff408);
  boost::operator<<(in_stack_fffffffffffff410,(char (*) [15])in_stack_fffffffffffff408);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff430);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10,0x3f,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff410);
  IncrementAndGet::IncrementAndGet((IncrementAndGet *)0x10cc7e);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
             ,0x6c);
  memset(&local_590,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff410);
  boost::basic_wrap_stringstream<char>::ref(&local_590);
  local_591 = 0x22;
  boost::operator<<(in_stack_fffffffffffff410,*in_stack_fffffffffffff408);
  boost::operator<<(in_stack_fffffffffffff410,(char (*) [16])in_stack_fffffffffffff408);
  boost::operator<<(in_stack_fffffffffffff410,(char (*) [16])in_stack_fffffffffffff408);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff430);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_3e8,0x3f,local_3f8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff410);
  boost::unit_test::setup_conditional<disruptor::test::SingleThreadedStrategy::IncrementAndGet>
            ((IncrementAndGet *)in_stack_fffffffffffff410);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_5a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
             ,0x6c);
  memset(&local_750,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff410);
  boost::basic_wrap_stringstream<char>::ref(&local_750);
  local_751 = 0x22;
  boost::operator<<(in_stack_fffffffffffff410,*in_stack_fffffffffffff408);
  boost::operator<<(in_stack_fffffffffffff410,(char (*) [16])in_stack_fffffffffffff408);
  boost::operator<<(in_stack_fffffffffffff410,(char (*) [13])in_stack_fffffffffffff408);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff430);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5a8,0x3f,local_5b8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff410);
  IncrementAndGet::test_method(in_stack_fffffffffffff550);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_768,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
             ,0x6c);
  memset(&local_910,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff410);
  boost::basic_wrap_stringstream<char>::ref(&local_910);
  local_911 = 0x22;
  boost::operator<<(in_stack_fffffffffffff410,*in_stack_fffffffffffff408);
  boost::operator<<(in_stack_fffffffffffff410,(char (*) [16])in_stack_fffffffffffff408);
  boost::operator<<(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff430);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_768,0x3f,local_778);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff410);
  boost::unit_test::teardown_conditional<disruptor::test::SingleThreadedStrategy::IncrementAndGet>
            ((IncrementAndGet *)in_stack_fffffffffffff410);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_928,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
             ,0x6c);
  memset(local_ad0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff410);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_ad0);
  boost::operator<<(in_stack_fffffffffffff410,*in_stack_fffffffffffff408);
  this = boost::operator<<(in_stack_fffffffffffff410,(char (*) [16])in_stack_fffffffffffff408);
  s = boost::operator<<(in_stack_fffffffffffff410,(char (*) [15])in_stack_fffffffffffff408);
  pbVar2 = (basic_wrap_stringstream<char> *)
           boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_928,0x3f,local_938);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar2);
  IncrementAndGet::~IncrementAndGet((IncrementAndGet *)0x10d116);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(IncrementAndGet) {
  int64_t return_value = strategy.IncrementAndGet(cursor, empty_dependents);
  BOOST_CHECK_EQUAL(return_value, kFirstSequenceValue);

  const size_t delta = 10;
  return_value = strategy.IncrementAndGet(cursor, empty_dependents, delta);
  BOOST_CHECK_EQUAL(return_value, kFirstSequenceValue + delta);
}